

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

void testing::internal::
     GenerateNamesRecursively<testing::internal::DefaultNameGenerator,testing::internal::Types<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>,yamc::alternate::timed_mutex,yamc::alternate::recursive_timed_mutex,yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>,yamc::posix::native_mutex,yamc::posix::native_recursive_mutex,yamc::posix::rwlock>>
               (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *param_1,
               int param_2)

{
  string asStackY_38 [4];
  int in_stack_ffffffffffffffcc;
  
  DefaultNameGenerator::GetName<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>>
            (in_stack_ffffffffffffffcc);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (param_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     asStackY_38);
  std::__cxx11::string::~string(asStackY_38);
  GenerateNamesRecursively<testing::internal::DefaultNameGenerator,testing::internal::Types<yamc::alternate::timed_mutex,yamc::alternate::recursive_timed_mutex,yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>,yamc::posix::native_mutex,yamc::posix::native_recursive_mutex,yamc::posix::rwlock>>
            (param_1,param_2 + 1);
  return;
}

Assistant:

void GenerateNamesRecursively(Types, std::vector<std::string>* result, int i) {
  result->push_back(NameGenerator::template GetName<typename Types::Head>(i));
  GenerateNamesRecursively<NameGenerator>(typename Types::Tail(), result,
                                          i + 1);
}